

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<long_long,_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase2
               (char lhs,
               SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  longlong lVar4;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDX
  ;
  char in_DIL;
  longlong tmp;
  undefined4 in_stack_ffffffffffffffd0;
  longlong *rhs_00;
  
  iVar3 = (int)in_DIL;
  cVar1 = std::numeric_limits<char>::min();
  if ((iVar3 == cVar1) &&
     (lVar4 = ::SafeInt::operator_cast_to_long_long
                        ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)CONCAT44(iVar3,in_stack_ffffffffffffffd0)), lVar4 == -1)) {
    rhs_00 = (longlong *)0x0;
    bVar2 = div_negate_min<long_long,_char,_true>::Value
                      ((longlong *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
    if (bVar2) {
      SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
      operator=(in_RDX,rhs_00);
      return true;
    }
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }